

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator-global.c
# Opt level: O0

int main(void)

{
  char local_d [8];
  char option;
  
  local_d[1] = '\0';
  local_d[2] = '\0';
  local_d[3] = '\0';
  local_d[4] = '\0';
  local_d[0] = '\0';
  printf("Hello! Welcome to the CWorkshop Calculator!\n\n");
  do {
    printf("Valor: %f\n",value);
    printf(
          "\'+\' - Sum; \'-\' - Subtract; \'*\' - Multiply; \'/\' - Divide; \'c\' - Clear; \'e\' - Exit\n\n"
          );
    printf("OPTION: ");
    __isoc99_scanf(" %c",local_d);
    switch(local_d[0]) {
    case '*':
      Multiply();
      break;
    case '+':
      Sum();
      break;
    default:
      break;
    case '-':
      Subtract();
      break;
    case '/':
      Divide();
      break;
    case 'c':
      Clear();
      break;
    case 'e':
    }
  } while (local_d[0] != 'e');
  return 0;
}

Assistant:

int main() {
    char option = 0;

    printf("Hello! Welcome to the CWorkshop Calculator!\n\n");
    do {
    
        printf("Valor: %f\n", value);
       
        printf("'+' - Sum; '-' - Subtract; '*' - Multiply; '/' - Divide; 'c' - Clear; 'e' - Exit\n\n");
        
        printf("OPTION: ");
        scanf(" %c", &option);
        
        switch (option) {
            case '+':
                Sum();
                break;
            case '-':
                Subtract();
                break;
            case '*':
                Multiply();
                break;
            case '/':
                Divide();
                break;
            case 'c':
                Clear();
                break;
            case 'e':
                break;
            default:
                break;
        }
    
    } while(option != 'e');
    
    return 0;
}